

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O1

void * Int2_ManReadInterpolant(sat_solver2 *pSat)

{
  uint uVar1;
  Gia_Man_t *p;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pFanout;
  Gia_Man_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  p = pSat->pInt2->pGia;
  pSat->pInt2->pGia = (Gia_Man_t *)0x0;
  uVar1 = pSat->hProofLast;
  if (uVar1 == 0xffffffff) {
    return (void *)0x0;
  }
  if (p->vCos->nSize == p->nRegs) {
    if (-1 < (int)uVar1) {
      uVar7 = uVar1 >> 1;
      if ((int)uVar7 < p->nObjs) {
        if ((~*(uint *)(p->pObjs + uVar7) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar7) < 0
           ) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x2d7,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pFanout = Gia_ManAppendObj(p);
        uVar2 = *(ulong *)pFanout;
        *(ulong *)pFanout = uVar2 | 0x80000000;
        pGVar3 = p->pObjs;
        if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
          uVar5 = (ulong)(((uint)((int)pFanout - (int)pGVar3) >> 2) * -0x55555555 - uVar7 &
                         0x1fffffff);
          uVar6 = (ulong)((uVar1 & 1) << 0x1d);
          *(ulong *)pFanout = uVar6 | uVar2 & 0xffffffffc0000000 | 0x80000000 | uVar5;
          *(ulong *)pFanout =
               uVar6 | uVar2 & 0xe0000000c0000000 | 0x80000000 | uVar5 |
               (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar3 = p->pObjs;
          if ((pGVar3 <= pFanout) && (pFanout < pGVar3 + p->nObjs)) {
            Vec_IntPush(p->vCos,(int)((ulong)((long)pFanout - (long)pGVar3) >> 2) * -0x55555555);
            if (p->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),
                               pFanout);
            }
            if ((p->pObjs <= pFanout) && (pFanout < p->pObjs + p->nObjs)) {
              pSat->hProofLast = -1;
              pGVar4 = Gia_ManCleanup(p);
              Gia_ManStop(p);
              return pGVar4;
            }
          }
        }
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
    }
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x2d6,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  __assert_fail("Gia_ManPoNum(pGia) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                ,0x58,"void *Int2_ManReadInterpolant(sat_solver2 *)");
}

Assistant:

void * Int2_ManReadInterpolant( sat_solver2 * pSat )
{
    Int2_Man_t * p = pSat->pInt2;
    Gia_Man_t * pTemp, * pGia = p->pGia; p->pGia = NULL;
    // return NULL, if the interpolant is not ready (for example, when the solver returned 'sat')
    if ( pSat->hProofLast == -1 )
        return NULL;
    // create AIG with one primary output
    assert( Gia_ManPoNum(pGia) == 0 );
    Gia_ManAppendCo( pGia, pSat->hProofLast );  
    pSat->hProofLast = -1;
    // cleanup the resulting AIG
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return (void *)pGia;
}